

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogManager.cpp
# Opt level: O2

bool __thiscall
helics::LogManager::sendToLogger
          (LogManager *this,int logLevel,string_view header,string_view message,bool fromRemote)

{
  int iVar1;
  pointer ppVar2;
  logger *plVar3;
  basic_string_view<char,_std::char_traits<char>_> __args_2;
  level_enum lVar4;
  bool bVar5;
  byte bVar6;
  int logLevel_00;
  bool bVar7;
  pointer ppVar8;
  format_string_t<std::basic_string_view<char>_&> fmt;
  format_string_t<std::basic_string_view<char>_&,_std::basic_string_view<char>_&> fmt_00;
  format_string_t<std::basic_string_view<char>_&> fmt_01;
  format_string_t<std::basic_string_view<char>_&,_std::basic_string_view<char>_&> fmt_02;
  string_view message_local;
  string_view header_local;
  ActionMessage remMess;
  
  message_local._M_str = message._M_str;
  message_local._M_len = message._M_len;
  header_local._M_str = header._M_str;
  header_local._M_len = header._M_len;
  logLevel_00 = logLevel + -99999;
  if (logLevel < 0x1863c) {
    logLevel_00 = logLevel;
  }
  bVar5 = 0x1863b < logLevel || fromRemote;
  bVar7 = true;
  if ((bVar5) || (logLevel_00 <= (this->maxLogLevel).super___atomic_base<int>._M_i)) {
    LogBuffer::push(&this->mLogBuffer,logLevel_00,(string_view)header,(string_view)message);
    if (!fromRemote) {
      ppVar2 = (this->remoteTargets).
               super__Vector_base<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (ppVar8 = (this->remoteTargets).
                    super__Vector_base<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppVar8 != ppVar2; ppVar8 = ppVar8 + 1
          ) {
        if ((((logLevel_00 <= ppVar8->second) && (iVar1 = (ppVar8->first).gid, iVar1 != -2010000000)
             ) && (iVar1 != -1700000000)) &&
           ((this->mTransmit).super__Function_base._M_manager != (_Manager_type)0x0)) {
          ActionMessage::ActionMessage(&remMess,cmd_remote_log);
          remMess.dest_id.gid = (ppVar8->first).gid;
          ActionMessage::setString(&remMess,0,(string_view)header);
          SmallBuffer::operator=
                    (&remMess.payload,
                     (basic_string_view<char,_std::char_traits<char>_> *)&message_local);
          std::function<void_(helics::ActionMessage_&&)>::operator()
                    ((function<void_(helics::ActionMessage_&&)> *)&this->mTransmit,&remMess);
          ActionMessage::~ActionMessage(&remMess);
        }
      }
    }
    if ((this->loggerFunction).super__Function_base._M_manager == (_Manager_type)0x0) {
      if (((this->initialized)._M_base._M_i & 1U) != 0) {
        bVar6 = ~bVar5;
        if (!(bool)(bVar6 & this->consoleLogLevel < logLevel_00)) {
          plVar3 = (this->consoleLogger).
                   super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (logLevel_00 == -10) {
            fmt.str.size_ = 2;
            fmt.str.data_ = "{}";
            spdlog::logger::log<std::basic_string_view<char,std::char_traits<char>>&>
                      (plVar3,trace,fmt,&message_local);
          }
          else {
            lVar4 = getSpdLogLevel(logLevel_00);
            fmt_00.str.size_ = 6;
            fmt_00.str.data_ = "{}::{}";
            spdlog::logger::
            log<std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
                      (plVar3,lVar4,fmt_00,&header_local,&message_local);
          }
          if (((this->forceLoggingFlush)._M_base._M_i & 1U) != 0) {
            spdlog::logger::flush
                      ((this->consoleLogger).
                       super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          }
        }
        plVar3 = (this->fileLogger).super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        if ((plVar3 != (logger *)0x0) && (!(bool)(bVar6 & this->fileLogLevel < logLevel_00))) {
          if (logLevel_00 == -10) {
            fmt_01.str.size_ = 2;
            fmt_01.str.data_ = "{}";
            spdlog::logger::log<std::basic_string_view<char,std::char_traits<char>>&>
                      (plVar3,trace,fmt_01,&message_local);
          }
          else {
            lVar4 = getSpdLogLevel(logLevel_00);
            fmt_02.str.size_ = 6;
            fmt_02.str.data_ = "{}::{}";
            spdlog::logger::
            log<std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
                      (plVar3,lVar4,fmt_02,&header_local,&message_local);
          }
          if (((this->forceLoggingFlush)._M_base._M_i & 1U) == 0) {
            return true;
          }
          spdlog::logger::flush
                    ((this->fileLogger).
                     super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          return true;
        }
        return true;
      }
    }
    else if ((0x1863b < logLevel || fromRemote) ||
             (logLevel_00 <= this->fileLogLevel || logLevel_00 <= this->consoleLogLevel)) {
      __args_2._M_str = message_local._M_str;
      __args_2._M_len = message_local._M_len;
      std::
      function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
      ::operator()((function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                    *)&this->loggerFunction,logLevel_00,
                   (basic_string_view<char,_std::char_traits<char>_>)header,__args_2);
    }
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool LogManager::sendToLogger(int logLevel,
                              std::string_view header,
                              std::string_view message,
                              bool fromRemote) const
{
    bool alwaysLog{fromRemote};
    if (logLevel > LogLevels::FED - 100) {
        logLevel -= static_cast<int>(LogLevels::FED);
        alwaysLog = true;
    }

    if (logLevel > maxLogLevel && !alwaysLog) {
        // check the logging level
        return true;
    }

    mLogBuffer.push(logLevel, header, message);
    if (!fromRemote) {
        for (const auto& rl : remoteTargets) {
            if (rl.second >= logLevel && rl.first.isValid()) {
                if (mTransmit) {
                    ActionMessage remMess(CMD_REMOTE_LOG);
                    remMess.dest_id = rl.first;
                    remMess.setString(0, header);
                    remMess.payload = message;
                    mTransmit(std::move(remMess));
                }
            }
        }
    }

    if (loggerFunction) {
        if (consoleLogLevel >= logLevel || fileLogLevel >= logLevel || alwaysLog) {
            loggerFunction(logLevel, header, message);
        }
    } else if (initialized.load()) {
        if (consoleLogLevel >= logLevel || alwaysLog) {
            if (logLevel == HELICS_LOG_LEVEL_DUMPLOG) {  // dumplog
                consoleLogger->log(spdlog::level::trace, "{}", message);
            } else {
                consoleLogger->log(getSpdLogLevel(logLevel), "{}::{}", header, message);
            }

            if (forceLoggingFlush) {
                consoleLogger->flush();
            }
        }
        if (fileLogger && (fileLogLevel >= logLevel || alwaysLog)) {
            if (logLevel == HELICS_LOG_LEVEL_DUMPLOG) {  // dumplog
                fileLogger->log(spdlog::level::trace, "{}", message);
            } else {
                fileLogger->log(getSpdLogLevel(logLevel), "{}::{}", header, message);
            }

            if (forceLoggingFlush) {
                fileLogger->flush();
            }
        }
        return true;
    }
    return false;
}